

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall tf::Executor::~Executor(Executor *this)

{
  bool bVar1;
  __normal_iterator<tf::Worker_*,_std::vector<tf::Worker,_std::allocator<tf::Worker>_>_> *p_Var2;
  atomic<bool> *in_RDI;
  Worker *w;
  iterator __end1;
  iterator __begin1;
  vector<tf::Worker,_std::allocator<tf::Worker>_> *__range1;
  size_t i;
  vector<tf::Worker,_std::allocator<tf::Worker>_> *in_stack_ffffffffffffffb8;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<tf::Worker_*,_std::vector<tf::Worker,_std::allocator<tf::Worker>_>_> local_20;
  atomic<bool> *local_18;
  Executor *in_stack_fffffffffffffff0;
  __normal_iterator<tf::Worker_*,_std::vector<tf::Worker,_std::allocator<tf::Worker>_>_> *__lhs;
  __normal_iterator<tf::Worker_*,_std::vector<tf::Worker,_std::allocator<tf::Worker>_>_> *__n;
  
  wait_for_all(in_stack_fffffffffffffff0);
  __lhs = (__normal_iterator<tf::Worker_*,_std::vector<tf::Worker,_std::allocator<tf::Worker>_>_> *)
          0x0;
  while( true ) {
    __n = __lhs;
    p_Var2 = (__normal_iterator<tf::Worker_*,_std::vector<tf::Worker,_std::allocator<tf::Worker>_>_>
              *)std::vector<tf::Worker,_std::allocator<tf::Worker>_>::size
                          ((vector<tf::Worker,_std::allocator<tf::Worker>_> *)(in_RDI + 0x28));
    if (p_Var2 <= __lhs) break;
    std::vector<tf::Worker,_std::allocator<tf::Worker>_>::operator[]
              ((vector<tf::Worker,_std::allocator<tf::Worker>_> *)(in_RDI + 0x28),(size_type)__n);
    std::atomic<bool>::store(in_RDI,SUB81((ulong)__lhs >> 0x38,0),(memory_order)__lhs);
    __lhs = (__normal_iterator<tf::Worker_*,_std::vector<tf::Worker,_std::allocator<tf::Worker>_>_>
             *)((long)&__n->_M_current + 1);
  }
  NonblockingNotifierV2::notify_all((NonblockingNotifierV2 *)0x10a2b8);
  local_18 = in_RDI + 0x28;
  local_20._M_current =
       (Worker *)
       std::vector<tf::Worker,_std::allocator<tf::Worker>_>::begin(in_stack_ffffffffffffffb8);
  std::vector<tf::Worker,_std::allocator<tf::Worker>_>::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (__lhs,(__normal_iterator<tf::Worker_*,_std::vector<tf::Worker,_std::allocator<tf::Worker>_>_>
                              *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<tf::Worker_*,_std::vector<tf::Worker,_std::allocator<tf::Worker>_>_>::
         operator*(&local_20);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<tf::Worker_*,_std::vector<tf::Worker,_std::allocator<tf::Worker>_>_>::
    operator++(&local_20);
  }
  std::
  unordered_set<std::shared_ptr<tf::ObserverInterface>,_std::hash<std::shared_ptr<tf::ObserverInterface>_>,_std::equal_to<std::shared_ptr<tf::ObserverInterface>_>,_std::allocator<std::shared_ptr<tf::ObserverInterface>_>_>
  ::~unordered_set((unordered_set<std::shared_ptr<tf::ObserverInterface>,_std::hash<std::shared_ptr<tf::ObserverInterface>_>,_std::equal_to<std::shared_ptr<tf::ObserverInterface>_>,_std::allocator<std::shared_ptr<tf::ObserverInterface>_>_>
                    *)0x10a339);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x10a34a);
  Freelist<tf::Node_*>::~Freelist((Freelist<tf::Node_*> *)0x10a35b);
  std::__cxx11::list<tf::Taskflow,_std::allocator<tf::Taskflow>_>::~list
            ((list<tf::Taskflow,_std::allocator<tf::Taskflow>_> *)0x10a36c);
  std::condition_variable::~condition_variable((condition_variable *)(in_RDI + 0x60));
  NonblockingNotifierV2::~NonblockingNotifierV2((NonblockingNotifierV2 *)0x10a388);
  std::vector<tf::Worker,_std::allocator<tf::Worker>_>::~vector
            ((vector<tf::Worker,_std::allocator<tf::Worker>_> *)in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline Executor::~Executor() {

  // wait for all topologies to complete
  wait_for_all();

  // shut down the scheduler
  for(size_t i=0; i<_workers.size(); ++i) {
  #if __cplusplus >= TF_CPP20
    _workers[i]._done.test_and_set(std::memory_order_relaxed);
  #else
    _workers[i]._done.store(true, std::memory_order_relaxed);
  #endif
  }

  _notifier.notify_all();

  for(auto& w : _workers) {
    w._thread.join();
  }
}